

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 * cfd::core::HashUtil::Sha256(ByteData256 *__return_storage_ptr__,Pubkey *pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  Pubkey::GetData((ByteData *)&local_28,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                     (ByteData *)&local_28);
  Sha256(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256(const Pubkey &pubkey) {
  return Sha256(pubkey.GetData().GetBytes());
}